

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

int evaluate_choose(dmr_C *C,expression *expr)

{
  longlong lVar1;
  undefined1 local_68 [8];
  ptr_list_iter argiter__;
  expression *peStack_48;
  int n;
  expression *args [3];
  void *local_28;
  expression *arg;
  expression_list *list;
  expression *expr_local;
  dmr_C *C_local;
  
  argiter__._20_4_ = 0;
  ptrlist_forward_iterator((ptr_list_iter *)local_68,(ptr_list *)(expr->field_5).field_2.string);
  local_28 = ptrlist_iter_next((ptr_list_iter *)local_68);
  while (local_28 != (void *)0x0) {
    *(void **)((long)&stack0xffffffffffffffb8 + (long)(int)argiter__._20_4_ * 8) = local_28;
    argiter__._20_4_ = argiter__._20_4_ + 1;
    local_28 = ptrlist_iter_next((ptr_list_iter *)local_68);
  }
  lVar1 = dmrC_get_expression_value(C,peStack_48);
  if (lVar1 == 0) {
    memcpy(expr,args[1],0x40);
  }
  else {
    memcpy(expr,args[0],0x40);
  }
  return 1;
}

Assistant:

static int evaluate_choose(struct dmr_C *C, struct expression *expr)
{
	struct expression_list *list = expr->args;
	struct expression *arg, *args[3];
	int n = 0;

	/* there will be exactly 3; we'd already verified that */
	FOR_EACH_PTR(list, arg) {
		args[n++] = arg;
	} END_FOR_EACH_PTR(arg);

	*expr = dmrC_get_expression_value(C, args[0]) ? *args[1] : *args[2];

	return 1;
}